

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void fuzz_deserializer(void)

{
  uint uVar1;
  void *__ptr;
  size_t j;
  char *buffer;
  size_t vec_size;
  size_t i;
  ulong local_20;
  ulong __size;
  char *data;
  
  for (data = (char *)0x0; data < (char *)0x2710; data = data + 1) {
    uVar1 = our_rand();
    __size = (ulong)uVar1 % 10000;
    __ptr = malloc(__size);
    for (local_20 = 0; local_20 < __size; local_20 = local_20 + 1) {
      uVar1 = our_rand();
      *(char *)((long)__ptr + local_20) = (char)uVar1;
    }
    deserialization_test(data,__size);
    free(__ptr);
  }
  return;
}

Assistant:

DEFINE_TEST(fuzz_deserializer) {
    for (size_t i = 0; i < 10000; i++) {
        size_t vec_size = our_rand() % 10000;
        char *buffer = malloc(vec_size);
        for (size_t j = 0; j < vec_size; j++) {
            buffer[j] = our_rand() % 256;
        }
        deserialization_test(buffer, vec_size);
        free(buffer);
    }
}